

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O2

void __thiscall
solitaire::SolitaireHandWithOneCardTest_ignoreSomeOperationsIfGameFinished_Test::TestBody
          (SolitaireHandWithOneCardTest_ignoreSomeOperationsIfGameFinished_Test *this)

{
  TypedExpectation<void_()> *this_00;
  TypedExpectation<void_(std::optional<solitaire::cards::Card>_&)> *this_01;
  TypedExpectation<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>
  *this_02;
  Solitaire *this_03;
  MoveCardsOperationSnapshotCreatorMock *in_RSI;
  MockSpec<void_(std::optional<solitaire::cards::Card>_&)> local_50;
  MatcherBase<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>
  local_30;
  PileId local_18;
  PileId local_14;
  
  SolitaireEmptyHandTest::finishGame((SolitaireEmptyHandTest *)this);
  local_50.function_mocker_ =
       (FunctionMocker<void_(std::optional<solitaire::cards::Card>_&)> *)
       archivers::MoveCardsOperationSnapshotCreatorMock::gmock_restoreSourcePile
                 ((MockSpec<void_()> *)
                  (this->super_SolitaireHandWithOneCardTest).super_SolitaireEmptyHandTest.
                  super_SolitaireTest.moveCardsOperationSnapshotCreatorMock.rawPointer,in_RSI);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<void_()>::InternalExpectedAt
                      ((MockSpec<void_()> *)&local_50,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                       ,0x1c2,"*moveCardsOperationSnapshotCreatorMock","restoreSourcePile()");
  testing::internal::TypedExpectation<void_()>::Times(this_00,0);
  local_30.vtable_ =
       (VTable *)
       &testing::internal::MatcherBase<std::optional<solitaire::cards::Card>&>::
        GetVTable<testing::internal::MatcherBase<std::optional<solitaire::cards::Card>&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
        ::kVTable;
  local_30.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_002ecad0;
  piles::FoundationPileMock::gmock_tryAddCard
            (&local_50,
             (this->super_SolitaireHandWithOneCardTest).super_SolitaireEmptyHandTest.
             super_SolitaireTest.lastFoundationPileMock,
             (Matcher<std::optional<solitaire::cards::Card>_&> *)&local_30);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<void_(std::optional<solitaire::cards::Card>_&)>::
            InternalExpectedAt(&local_50,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                               ,0x1c3,"lastFoundationPileMock","tryAddCard(_)");
  testing::internal::TypedExpectation<void_(std::optional<solitaire::cards::Card>_&)>::Times
            (this_01,0);
  testing::internal::MatcherBase<std::optional<solitaire::cards::Card>_&>::~MatcherBase
            ((MatcherBase<std::optional<solitaire::cards::Card>_&> *)&local_50.matchers_);
  testing::internal::MatcherBase<std::optional<solitaire::cards::Card>_&>::~MatcherBase
            ((MatcherBase<std::optional<solitaire::cards::Card>_&> *)&local_30);
  local_30.vtable_ =
       (VTable *)
       testing::internal::
       MatcherBase<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>&>::
       GetVTable<testing::internal::MatcherBase<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_30.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_002ecdb8;
  piles::TableauPileMock::gmock_tryAddCards
            ((MockSpec<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>
              *)&local_50,
             (this->super_SolitaireHandWithOneCardTest).super_SolitaireEmptyHandTest.
             super_SolitaireTest.lastTableauPileMock,
             (Matcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>
              *)&local_30);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::
            MockSpec<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>
            ::InternalExpectedAt
                      ((MockSpec<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>
                        *)&local_50,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                       ,0x1c4,"lastTableauPileMock","tryAddCards(_)");
  testing::internal::
  TypedExpectation<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>
  ::Times(this_02,0);
  testing::internal::
  MatcherBase<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>::
  ~MatcherBase((MatcherBase<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>
                *)&local_50.matchers_);
  testing::internal::
  MatcherBase<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>::
  ~MatcherBase(&local_30);
  this_03 = &(this->super_SolitaireHandWithOneCardTest).super_SolitaireEmptyHandTest.
             super_SolitaireTest.solitaire;
  Solitaire::tryPutCardsBackFromHand(this_03);
  local_14.t = (anonymous_namespace)::lastFoundationPileId;
  Solitaire::tryAddCardOnFoundationPile(this_03,&local_14);
  local_18.t = (anonymous_namespace)::lastTableauPileId;
  Solitaire::tryAddCardsOnTableauPile(this_03,&local_18);
  return;
}

Assistant:

TEST_F(SolitaireHandWithOneCardTest, ignoreSomeOperationsIfGameFinished) {
    finishGame();

    EXPECT_CALL(*moveCardsOperationSnapshotCreatorMock, restoreSourcePile()).Times(0);
    EXPECT_CALL(lastFoundationPileMock, tryAddCard(_)).Times(0);
    EXPECT_CALL(lastTableauPileMock, tryAddCards(_)).Times(0);

    solitaire.tryPutCardsBackFromHand();
    solitaire.tryAddCardOnFoundationPile(lastFoundationPileId);
    solitaire.tryAddCardsOnTableauPile(lastTableauPileId);
}